

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall
btQuantizedBvh::deSerializeFloat
          (btQuantizedBvh *this,btQuantizedBvhFloatData *quantizedBvhFloatData)

{
  int iVar1;
  btOptimizedBvhNode *pbVar2;
  btQuantizedBvhNode *pbVar3;
  btBvhSubtreeInfo *pbVar4;
  btVector3FloatData *in_RSI;
  long in_RDI;
  int i_2;
  btBvhSubtreeInfoData *memPtr_2;
  int numElem_2;
  int i_1;
  btQuantizedBvhNodeData *memPtr_1;
  int numElem_1;
  int i;
  btOptimizedBvhNodeFloatData *memPtr;
  int numElem;
  undefined2 in_stack_fffffffffffffef0;
  unsigned_short uVar5;
  undefined2 in_stack_fffffffffffffef2;
  undefined2 in_stack_fffffffffffffef4;
  undefined2 in_stack_fffffffffffffef6;
  btOptimizedBvhNode *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  float fVar6;
  int in_stack_ffffffffffffff10;
  unsigned_short in_stack_ffffffffffffff14;
  unsigned_short in_stack_ffffffffffffff16;
  int local_b4;
  int *local_b0;
  btBvhSubtreeInfo local_a8;
  float local_88;
  int local_84;
  unsigned_short *local_80;
  undefined1 local_78 [16];
  float local_68;
  int local_64;
  btVector3FloatData *local_60;
  undefined1 local_54 [64];
  float local_14;
  btVector3FloatData *local_10;
  
  local_10 = in_RSI;
  btVector3::deSerializeFloat((btVector3 *)(in_RDI + 0x18),in_RSI + 1);
  btVector3::deSerializeFloat((btVector3 *)(in_RDI + 8),local_10);
  btVector3::deSerializeFloat((btVector3 *)(in_RDI + 0x28),local_10 + 2);
  *(float *)(in_RDI + 0x3c) = local_10[3].m_floats[0];
  *(bool *)(in_RDI + 0x40) = local_10[3].m_floats[1] != 0.0;
  local_14 = local_10[3].m_floats[2];
  memset(local_54,0,0x40);
  btOptimizedBvhNode::btOptimizedBvhNode
            ((btOptimizedBvhNode *)
             CONCAT26(in_stack_fffffffffffffef6,
                      CONCAT24(in_stack_fffffffffffffef4,
                               CONCAT22(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0))));
  btAlignedObjectArray<btOptimizedBvhNode>::resize
            ((btAlignedObjectArray<btOptimizedBvhNode> *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
             in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
  if (local_14 != 0.0) {
    local_60 = *(btVector3FloatData **)local_10[4].m_floats;
    for (local_64 = 0; local_64 < (int)local_14; local_64 = local_64 + 1) {
      pbVar2 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_64);
      btVector3::deSerializeFloat(&pbVar2->m_aabbMaxOrg,local_60 + 1);
      pbVar2 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_64);
      btVector3::deSerializeFloat(&pbVar2->m_aabbMinOrg,local_60);
      fVar6 = local_60[2].m_floats[0];
      pbVar2 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_64);
      pbVar2->m_escapeIndex = (int)fVar6;
      fVar6 = local_60[2].m_floats[1];
      pbVar2 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_64);
      pbVar2->m_subPart = (int)fVar6;
      fVar6 = local_60[2].m_floats[2];
      pbVar2 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_64);
      pbVar2->m_triangleIndex = (int)fVar6;
      local_60 = local_60 + 3;
    }
  }
  local_68 = local_10[3].m_floats[3];
  memset(local_78,0,0x10);
  btAlignedObjectArray<btQuantizedBvhNode>::resize
            ((btAlignedObjectArray<btQuantizedBvhNode> *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
             in_stack_ffffffffffffff0c,(btQuantizedBvhNode *)in_stack_ffffffffffffff00);
  if (local_68 != 0.0) {
    local_80 = *(unsigned_short **)(local_10[4].m_floats + 2);
    for (local_84 = 0; local_84 < (int)local_68; local_84 = local_84 + 1) {
      in_stack_ffffffffffffff10 = *(int *)(local_80 + 6);
      pbVar3 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar3->m_escapeIndexOrTriangleIndex = in_stack_ffffffffffffff10;
      in_stack_ffffffffffffff14 = local_80[3];
      pbVar3 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar3->m_quantizedAabbMax[0] = in_stack_ffffffffffffff14;
      in_stack_ffffffffffffff16 = local_80[4];
      pbVar3 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar3->m_quantizedAabbMax[1] = in_stack_ffffffffffffff16;
      uVar5 = local_80[5];
      pbVar3 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar3->m_quantizedAabbMax[2] = uVar5;
      uVar5 = *local_80;
      pbVar3 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar3->m_quantizedAabbMin[0] = uVar5;
      uVar5 = local_80[1];
      pbVar3 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar3->m_quantizedAabbMin[1] = uVar5;
      uVar5 = local_80[2];
      pbVar3 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar3->m_quantizedAabbMin[2] = uVar5;
      local_80 = local_80 + 8;
    }
  }
  *(float *)(in_RDI + 200) = local_10[5].m_floats[2];
  fVar6 = local_10[5].m_floats[3];
  pbVar4 = (btBvhSubtreeInfo *)(in_RDI + 0xd0);
  local_88 = fVar6;
  btBvhSubtreeInfo::btBvhSubtreeInfo(&local_a8);
  btAlignedObjectArray<btBvhSubtreeInfo>::resize
            ((btAlignedObjectArray<btBvhSubtreeInfo> *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),(int)fVar6,
             pbVar4);
  if (local_88 != 0.0) {
    local_b0 = *(int **)local_10[5].m_floats;
    for (local_b4 = 0; local_b4 < (int)local_88; local_b4 = local_b4 + 1) {
      uVar5 = *(unsigned_short *)((long)local_b0 + 0xe);
      pbVar4 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar4->m_quantizedAabbMax[0] = uVar5;
      uVar5 = *(unsigned_short *)(local_b0 + 4);
      pbVar4 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar4->m_quantizedAabbMax[1] = uVar5;
      uVar5 = *(unsigned_short *)((long)local_b0 + 0x12);
      pbVar4 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar4->m_quantizedAabbMax[2] = uVar5;
      uVar5 = *(unsigned_short *)(local_b0 + 2);
      pbVar4 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar4->m_quantizedAabbMin[0] = uVar5;
      uVar5 = *(unsigned_short *)((long)local_b0 + 10);
      pbVar4 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar4->m_quantizedAabbMin[1] = uVar5;
      uVar5 = *(unsigned_short *)(local_b0 + 3);
      pbVar4 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar4->m_quantizedAabbMin[2] = uVar5;
      iVar1 = *local_b0;
      pbVar4 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar4->m_rootNodeIndex = iVar1;
      iVar1 = local_b0[1];
      pbVar4 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar4->m_subtreeSize = iVar1;
      local_b0 = local_b0 + 5;
    }
  }
  return;
}

Assistant:

void btQuantizedBvh::deSerializeFloat(struct btQuantizedBvhFloatData& quantizedBvhFloatData)
{
	m_bvhAabbMax.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMax);
	m_bvhAabbMin.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMin);
	m_bvhQuantization.deSerializeFloat(quantizedBvhFloatData.m_bvhQuantization);

	m_curNodeIndex = quantizedBvhFloatData.m_curNodeIndex;
	m_useQuantization = quantizedBvhFloatData.m_useQuantization!=0;
	
	{
		int numElem = quantizedBvhFloatData.m_numContiguousLeafNodes;
		m_contiguousNodes.resize(numElem);

		if (numElem)
		{
			btOptimizedBvhNodeFloatData* memPtr = quantizedBvhFloatData.m_contiguousNodesPtr;

			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_contiguousNodes[i].m_aabbMaxOrg.deSerializeFloat(memPtr->m_aabbMaxOrg);
				m_contiguousNodes[i].m_aabbMinOrg.deSerializeFloat(memPtr->m_aabbMinOrg);
				m_contiguousNodes[i].m_escapeIndex = memPtr->m_escapeIndex;
				m_contiguousNodes[i].m_subPart = memPtr->m_subPart;
				m_contiguousNodes[i].m_triangleIndex = memPtr->m_triangleIndex;
			}
		}
	}

	{
		int numElem = quantizedBvhFloatData.m_numQuantizedContiguousNodes;
		m_quantizedContiguousNodes.resize(numElem);
		
		if (numElem)
		{
			btQuantizedBvhNodeData* memPtr = quantizedBvhFloatData.m_quantizedContiguousNodesPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex = memPtr->m_escapeIndexOrTriangleIndex;
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
			}
		}
	}

	m_traversalMode = btTraversalMode(quantizedBvhFloatData.m_traversalMode);
	
	{
		int numElem = quantizedBvhFloatData.m_numSubtreeHeaders;
		m_SubtreeHeaders.resize(numElem);
		if (numElem)
		{
			btBvhSubtreeInfoData* memPtr = quantizedBvhFloatData.m_subTreeInfoPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_SubtreeHeaders[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0] ;
				m_SubtreeHeaders[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_SubtreeHeaders[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_SubtreeHeaders[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_SubtreeHeaders[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_SubtreeHeaders[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
				m_SubtreeHeaders[i].m_rootNodeIndex = memPtr->m_rootNodeIndex;
				m_SubtreeHeaders[i].m_subtreeSize = memPtr->m_subtreeSize;
			}
		}
	}
}